

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O2

uint64_t capnp::_::anon_unknown_0::traverse(Reader reader)

{
  Reader list;
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  undefined8 in_stack_00000010;
  long in_stack_00000018;
  undefined8 in_stack_00000020;
  uint in_stack_00000028;
  undefined2 in_stack_0000002c;
  undefined2 in_stack_0000002e;
  undefined4 in_stack_00000030;
  undefined1 in_stack_00000034 [12];
  
  lVar2 = 0;
  for (uVar3 = 0; in_stack_00000028 >> 3 != uVar3; uVar3 = uVar3 + 1) {
    lVar2 = lVar2 + (ulong)*(byte *)(in_stack_00000018 + uVar3);
  }
  list.reader.capTable = (CapTableReader *)in_stack_00000018;
  list.reader.segment = (SegmentReader *)in_stack_00000010;
  list.reader.ptr = (byte *)in_stack_00000020;
  list.reader.elementCount = in_stack_00000028;
  list.reader.step._0_2_ = in_stack_0000002c;
  list.reader.step._2_2_ = in_stack_0000002e;
  list.reader.structDataSize = in_stack_00000030;
  list.reader._36_12_ = in_stack_00000034;
  uVar1 = (anonymous_namespace)::traverseList<capnp::List<capnp::AnyPointer,(capnp::Kind)7>::Reader>
                    (list);
  return uVar1 + lVar2;
}

Assistant:

uint64_t traverse(AnyStruct::Reader reader) {
  uint64_t result = 0;
  for (byte b: reader.getDataSection()) {
    result += b;
  }
  result += traverseList(reader.getPointerSection());
  return result;
}